

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall
Am_Inter_Location::Get_Location
          (Am_Inter_Location *this,bool *as_line,Am_Object *ref_obj,int *a,int *b,int *c,int *d)

{
  int *c_local;
  int *b_local;
  int *a_local;
  Am_Object *ref_obj_local;
  bool *as_line_local;
  Am_Inter_Location *this_local;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  *as_line = (bool)(this->data->as_line & 1);
  Am_Object::operator=(ref_obj,&this->data->ref_obj);
  *a = (this->data->data).rect.left;
  *b = (this->data->data).rect.top;
  *c = (this->data->data).rect.width;
  *d = (this->data->data).rect.height;
  return;
}

Assistant:

void
Am_Inter_Location::Get_Location(bool &as_line, Am_Object &ref_obj, int &a,
                                int &b, int &c, int &d) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  as_line = data->as_line;
  ref_obj = data->ref_obj;
  a = data->data.line.x1;
  b = data->data.line.y1;
  c = data->data.line.x2;
  d = data->data.line.y2;
}